

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

void __thiscall
LNodeF0Stmt::LNodeF0Stmt
          (LNodeF0Stmt *this,shared_ptr<LNode> *var,shared_ptr<LNode> *from_expr,
          shared_ptr<LNode> *to_expr,shared_ptr<LNode> *stmts)

{
  shared_ptr<LNode> *stmts_local;
  shared_ptr<LNode> *to_expr_local;
  shared_ptr<LNode> *from_expr_local;
  shared_ptr<LNode> *var_local;
  LNodeF0Stmt *this_local;
  
  std::shared_ptr<LNode>::shared_ptr(&this->var);
  std::shared_ptr<LNode>::shared_ptr(&this->from_expr);
  std::shared_ptr<LNode>::shared_ptr(&this->to_expr);
  std::shared_ptr<LNode>::shared_ptr(&this->stmts);
  std::shared_ptr<LNode>::operator=(&this->var,var);
  std::shared_ptr<LNode>::operator=(&this->from_expr,from_expr);
  std::shared_ptr<LNode>::operator=(&this->to_expr,to_expr);
  std::shared_ptr<LNode>::operator=(&this->stmts,stmts);
  return;
}

Assistant:

LNodeF0Stmt(std::shared_ptr<LNode> var, std::shared_ptr<LNode> from_expr,
                std::shared_ptr<LNode> to_expr, std::shared_ptr<LNode> stmts) {
        this->var = std::move(var);
        this->from_expr = std::move(from_expr);
        this->to_expr = std::move(to_expr);
        this->stmts = std::move(stmts);
    }